

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BondAngleDistribution.cpp
# Opt level: O0

void __thiscall OpenMD::BondAngleDistribution::process(BondAngleDistribution *this)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  Globals *pos;
  SnapshotManager *this_00;
  Snapshot *pSVar4;
  reference pvVar5;
  long in_RDI;
  double dVar6;
  int whichBin;
  RealType theta;
  Vector3d vec2;
  int j;
  Vector3d vec1;
  int i_1;
  int istep;
  int nFrames;
  DumpReader reader;
  bool usePeriodicBoundaryConditions_;
  int i;
  int nBonds;
  RealType r;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> bondvec;
  Vector3d vec;
  StuntDouble *sd;
  AtomIterator ai;
  MoleculeIterator mi;
  int myIndex;
  Atom *atom;
  Molecule *mol;
  StuntDouble *in_stack_ffffffffffffebd8;
  DumpReader *in_stack_ffffffffffffebe0;
  StuntDouble *in_stack_ffffffffffffebe8;
  SelectionManager *in_stack_ffffffffffffebf0;
  iterator *in_stack_ffffffffffffebf8;
  undefined4 in_stack_ffffffffffffec00;
  int in_stack_ffffffffffffec04;
  undefined4 in_stack_ffffffffffffec18;
  int in_stack_ffffffffffffec1c;
  undefined4 in_stack_ffffffffffffec60;
  int in_stack_ffffffffffffec64;
  double in_stack_ffffffffffffec68;
  DumpReader *in_stack_ffffffffffffec70;
  int local_1374;
  int local_1354;
  int local_12f0;
  string *in_stack_ffffffffffffee30;
  SimInfo *in_stack_ffffffffffffee38;
  DumpReader *in_stack_ffffffffffffee40;
  BondAngleDistribution *in_stack_ffffffffffffeef0;
  int local_74;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_68 [2];
  StuntDouble *local_38;
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  local_30;
  _Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_> local_28;
  int local_1c;
  SelectionManager *local_18;
  DumpReader *local_10;
  
  std::_Rb_tree_iterator<std::pair<const_int,_OpenMD::Molecule_*>_>::_Rb_tree_iterator(&local_28);
  __gnu_cxx::
  __normal_iterator<OpenMD::Atom_**,_std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>_>
  ::__normal_iterator(&local_30);
  Vector3<double>::Vector3((Vector3<double> *)0x13a803);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)0x13a810)
  ;
  pos = SimInfo::getSimParams(*(SimInfo **)(in_RDI + 8));
  bVar1 = Globals::getUsePeriodicBoundaryConditions((Globals *)0x13a835);
  DumpReader::DumpReader
            (in_stack_ffffffffffffee40,in_stack_ffffffffffffee38,in_stack_ffffffffffffee30);
  iVar3 = DumpReader::getNFrames(in_stack_ffffffffffffebe0);
  *(undefined4 *)(in_RDI + 0x710) = 0;
  *(undefined4 *)(in_RDI + 0x750) = 0;
  for (local_12f0 = 0; local_12f0 < iVar3; local_12f0 = *(int *)(in_RDI + 0x30) + local_12f0) {
    DumpReader::readFrame(in_stack_ffffffffffffec70,(int)((ulong)in_stack_ffffffffffffec68 >> 0x20))
    ;
    *(int *)(in_RDI + 0x710) = *(int *)(in_RDI + 0x710) + 1;
    this_00 = SimInfo::getSnapshotManager(*(SimInfo **)(in_RDI + 8));
    pSVar4 = SnapshotManager::getCurrentSnapshot(this_00);
    *(Snapshot **)(in_RDI + 200) = pSVar4;
    bVar2 = SelectionEvaluator::isDynamic((SelectionEvaluator *)(in_RDI + 0x1b8));
    if (bVar2) {
      SelectionEvaluator::evaluate
                ((SelectionEvaluator *)CONCAT44(in_stack_ffffffffffffec1c,in_stack_ffffffffffffec18)
                );
      SelectionManager::setSelectionSet
                (in_stack_ffffffffffffebf0,(SelectionSet *)in_stack_ffffffffffffebe8);
      SelectionSet::~SelectionSet((SelectionSet *)0x13a97e);
    }
    local_38 = SelectionManager::beginSelected
                         (in_stack_ffffffffffffebf0,(int *)in_stack_ffffffffffffebe8);
    while (local_38 != (StuntDouble *)0x0) {
      in_stack_ffffffffffffec1c = StuntDouble::getGlobalIndex(local_38);
      local_74 = 0;
      local_1c = in_stack_ffffffffffffec1c;
      std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::clear
                ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
                 0x13aa4a);
      local_10 = (DumpReader *)
                 SimInfo::beginMolecule
                           ((SimInfo *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00)
                            ,(MoleculeIterator *)in_stack_ffffffffffffebf8);
      while (local_10 != (DumpReader *)0x0) {
        local_18 = (SelectionManager *)
                   Molecule::beginAtom((Molecule *)
                                       CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00)
                                       ,in_stack_ffffffffffffebf8);
        while (local_18 != (SelectionManager *)0x0) {
          in_stack_ffffffffffffec04 = StuntDouble::getGlobalIndex((StuntDouble *)local_18);
          if (in_stack_ffffffffffffec04 != local_1c) {
            StuntDouble::getPos(in_stack_ffffffffffffebe8);
            StuntDouble::getPos(in_stack_ffffffffffffebe8);
            OpenMD::operator-((Vector<double,_3U> *)in_stack_ffffffffffffebe8,
                              (Vector<double,_3U> *)in_stack_ffffffffffffebe0);
            Vector3<double>::operator=
                      ((Vector3<double> *)in_stack_ffffffffffffebe8,
                       (Vector<double,_3U> *)in_stack_ffffffffffffebe0);
            if (bVar1) {
              Snapshot::wrapVector
                        ((Snapshot *)CONCAT44(in_stack_ffffffffffffec64,in_stack_ffffffffffffec60),
                         (Vector3d *)pos);
            }
            in_stack_ffffffffffffebf8 =
                 (iterator *)Vector<double,_3U>::length((Vector<double,_3U> *)0x13ab77);
            if ((double)in_stack_ffffffffffffebf8 < *(double *)(in_RDI + 0x708)) {
              std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
              push_back((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         *)in_stack_ffffffffffffebf0,(value_type *)in_stack_ffffffffffffebe8);
              local_74 = local_74 + 1;
              *(int *)(in_RDI + 0x750) = *(int *)(in_RDI + 0x750) + 1;
            }
          }
          in_stack_ffffffffffffebf0 =
               (SelectionManager *)
               Molecule::nextAtom((Molecule *)
                                  CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
                                  in_stack_ffffffffffffebf8);
          local_18 = in_stack_ffffffffffffebf0;
        }
        for (local_1354 = 0; local_1354 < local_74 + -1; local_1354 = local_1354 + 1) {
          std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
          operator[](local_68,(long)local_1354);
          Vector3<double>::Vector3
                    ((Vector3<double> *)in_stack_ffffffffffffebe0,
                     (Vector3<double> *)in_stack_ffffffffffffebd8);
          Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffebe0);
          local_1374 = local_1354;
          while (local_1374 = local_1374 + 1, local_1374 < local_74) {
            std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::
            operator[](local_68,(long)local_1374);
            Vector3<double>::Vector3
                      ((Vector3<double> *)in_stack_ffffffffffffebe0,
                       (Vector3<double> *)in_stack_ffffffffffffebd8);
            Vector<double,_3U>::normalize((Vector<double,_3U> *)in_stack_ffffffffffffebe0);
            in_stack_ffffffffffffebe8 =
                 (StuntDouble *)
                 dot<double,3u>((Vector<double,_3U> *)in_stack_ffffffffffffebf0,
                                (Vector<double,_3U> *)in_stack_ffffffffffffebe8);
            dVar6 = acos((double)in_stack_ffffffffffffebe8);
            in_stack_ffffffffffffec68 = (dVar6 * 180.0) / 3.141592653589793;
            if (180.0 < in_stack_ffffffffffffec68) {
              in_stack_ffffffffffffec68 = 360.0 - in_stack_ffffffffffffec68;
            }
            in_stack_ffffffffffffec64 =
                 (int)(in_stack_ffffffffffffec68 / *(double *)(in_RDI + 0x718));
            pvVar5 = std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x738),
                                (long)in_stack_ffffffffffffec64);
            *pvVar5 = *pvVar5 + 2;
          }
        }
        in_stack_ffffffffffffebe0 =
             (DumpReader *)
             SimInfo::nextMolecule
                       ((SimInfo *)CONCAT44(in_stack_ffffffffffffec04,in_stack_ffffffffffffec00),
                        (MoleculeIterator *)in_stack_ffffffffffffebf8);
        local_10 = in_stack_ffffffffffffebe0;
      }
      in_stack_ffffffffffffebd8 =
           SelectionManager::nextSelected
                     (in_stack_ffffffffffffebf0,(int *)in_stack_ffffffffffffebe8);
      local_38 = in_stack_ffffffffffffebd8;
    }
  }
  writeBondAngleDistribution(in_stack_ffffffffffffeef0);
  DumpReader::~DumpReader(in_stack_ffffffffffffebe0);
  std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::~vector
            ((vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *)
             in_stack_ffffffffffffebf0);
  return;
}

Assistant:

void BondAngleDistribution::process() {
    Molecule* mol;
    Atom* atom;
    int myIndex;
    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    StuntDouble* sd;
    Vector3d vec;
    std::vector<Vector3d> bondvec;
    RealType r;
    int nBonds;
    int i;

    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    DumpReader reader(info_, dumpFilename_);
    int nFrames   = reader.getNFrames();
    frameCounter_ = 0;

    nTotBonds_ = 0;

    for (int istep = 0; istep < nFrames; istep += step_) {
      reader.readFrame(istep);
      frameCounter_++;
      currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();

      if (evaluator_.isDynamic()) {
        seleMan_.setSelectionSet(evaluator_.evaluate());
      }

      // outer loop is over the selected StuntDoubles:

      for (sd = seleMan_.beginSelected(i); sd != NULL;
           sd = seleMan_.nextSelected(i)) {
        myIndex = sd->getGlobalIndex();
        nBonds  = 0;
        bondvec.clear();

        // inner loop is over all other atoms in the system:

        for (mol = info_->beginMolecule(mi); mol != NULL;
             mol = info_->nextMolecule(mi)) {
          for (atom = mol->beginAtom(ai); atom != NULL;
               atom = mol->nextAtom(ai)) {
            if (atom->getGlobalIndex() != myIndex) {
              vec = sd->getPos() - atom->getPos();

              if (usePeriodicBoundaryConditions_)
                currentSnapshot_->wrapVector(vec);

              // Calculate "bonds" and make a pair list

              r = vec.length();

              // Check to see if neighbor is in bond cutoff

              if (r < rCut_) {
                // Add neighbor to bond list's
                bondvec.push_back(vec);
                nBonds++;
                nTotBonds_++;
              }
            }
          }

          for (int i = 0; i < nBonds - 1; i++) {
            Vector3d vec1 = bondvec[i];
            vec1.normalize();
            for (int j = i + 1; j < nBonds; j++) {
              Vector3d vec2 = bondvec[j];

              vec2.normalize();

              RealType theta = acos(dot(vec1, vec2)) * 180.0 / Constants::PI;

              if (theta > 180.0) { theta = 360.0 - theta; }
              int whichBin = int(theta / deltaTheta_);

              histogram_[whichBin] += 2;
            }
          }
        }
      }
    }

    writeBondAngleDistribution();
  }